

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

cubeb_resampler *
cubeb_resampler_create_internal<float>
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality,cubeb_resampler_reclock reclock)

{
  bool bVar1;
  pointer pcVar2;
  pointer ptr;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  cubeb_resampler_quality in_stack_00000008;
  unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> output_delay;
  unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> input_delay;
  unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
  output_resampler;
  unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
  input_resampler;
  int in_stack_0000ff20;
  uint32_t in_stack_0000ff24;
  uint32_t in_stack_0000ff28;
  uint32_t in_stack_0000ff2c;
  cubeb_resampler_speex_one_way<float> *in_stack_0000ff30;
  pointer in_stack_ffffffffffffff08;
  cubeb_resampler_speex_one_way<float> *in_stack_ffffffffffffff10;
  cubeb_stream *in_stack_ffffffffffffff18;
  cubeb_resampler_speex_one_way<float> *in_stack_ffffffffffffff20;
  cubeb_resampler_speex_one_way<float> *in_stack_ffffffffffffff28;
  cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
  *in_stack_ffffffffffffff30;
  cubeb_resampler_speex_one_way<float> *local_8;
  
  std::
  unique_ptr<cubeb_resampler_speex_one_way<float>,std::default_delete<cubeb_resampler_speex_one_way<float>>>
  ::unique_ptr<std::default_delete<cubeb_resampler_speex_one_way<float>>,void>
            ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
              *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::
  unique_ptr<cubeb_resampler_speex_one_way<float>,std::default_delete<cubeb_resampler_speex_one_way<float>>>
  ::unique_ptr<std::default_delete<cubeb_resampler_speex_one_way<float>>,void>
            ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
              *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::unique_ptr<delay_line<float>,std::default_delete<delay_line<float>>>::
  unique_ptr<std::default_delete<delay_line<float>>,void>
            ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::unique_ptr<delay_line<float>,std::default_delete<delay_line<float>>>::
  unique_ptr<std::default_delete<delay_line<float>>,void>
            ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if ((((((in_RSI == 0) || (*(uint *)(in_RSI + 4) != in_ECX)) || (in_RDX == 0)) ||
       (*(uint *)(in_RDX + 4) != in_ECX)) &&
      (((in_RSI == 0 || (in_RDX != 0)) || (*(uint *)(in_RSI + 4) != in_ECX)))) &&
     (((in_RDX == 0 || (in_RSI != 0)) || (*(uint *)(in_RDX + 4) != in_ECX)))) {
    if ((in_RDX != 0) && (*(uint *)(in_RDX + 4) != in_ECX)) {
      operator_new(0x58);
      to_speex_quality(in_stack_00000008);
      cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                (in_stack_0000ff30,in_stack_0000ff2c,in_stack_0000ff28,in_stack_0000ff24,
                 in_stack_0000ff20);
      std::
      unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
      ::reset((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
               *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                          *)0x115ce4);
      if (!bVar1) {
        local_8 = (cubeb_resampler_speex_one_way<float> *)0x0;
        goto LAB_0011621e;
      }
    }
    if ((in_RSI != 0) && (*(uint *)(in_RSI + 4) != in_ECX)) {
      operator_new(0x58);
      to_speex_quality(in_stack_00000008);
      cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                (in_stack_0000ff30,in_stack_0000ff2c,in_stack_0000ff28,in_stack_0000ff24,
                 in_stack_0000ff20);
      std::
      unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
      ::reset((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
               *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                          *)0x115da9);
      if (!bVar1) {
        local_8 = (cubeb_resampler_speex_one_way<float> *)0x0;
        goto LAB_0011621e;
      }
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                        *)0x115dd8);
    if ((((!bVar1) ||
         (bVar1 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                              *)0x115dee), bVar1)) || (in_RSI == 0)) || (in_RDX == 0)) {
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                          *)0x115eab);
      if (((bVar1) &&
          (bVar1 = std::unique_ptr::operator_cast_to_bool
                             ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                               *)0x115ec1), !bVar1)) && ((in_RSI != 0 && (in_RDX != 0)))) {
        operator_new(0x48);
        std::
        unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
        ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                      *)0x115f03);
        cubeb_resampler_speex_one_way<float>::latency(in_stack_ffffffffffffff10);
        delay_line<float>::delay_line
                  ((delay_line<float> *)in_stack_ffffffffffffff20,
                   (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                   (uint32_t)in_stack_ffffffffffffff18,
                   (uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20));
        std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::reset
                  ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
                   in_stack_ffffffffffffff10,(pointer)in_stack_ffffffffffffff08);
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>
                            *)0x115f4c);
        if (!bVar1) {
          local_8 = (cubeb_resampler_speex_one_way<float> *)0x0;
          goto LAB_0011621e;
        }
      }
    }
    else {
      operator_new(0x48);
      std::
      unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                    *)0x115e30);
      cubeb_resampler_speex_one_way<float>::latency(in_stack_ffffffffffffff10);
      delay_line<float>::delay_line
                ((delay_line<float> *)in_stack_ffffffffffffff20,
                 (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 (uint32_t)in_stack_ffffffffffffff18,
                 (uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::reset
                ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
                 in_stack_ffffffffffffff10,(pointer)in_stack_ffffffffffffff08);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
                         0x115e79);
      if (!bVar1) {
        local_8 = (cubeb_resampler_speex_one_way<float> *)0x0;
        goto LAB_0011621e;
      }
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                        *)0x115f7d);
    if ((bVar1) &&
       (bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                            *)0x115f93), bVar1)) {
      if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Resampling input (%d) and output (%d) to target rate of %dHz\n",
                   "cubeb_resampler_internal.h",0x236,(ulong)*(uint *)(in_RSI + 4),
                   (ulong)*(uint *)(in_RDX + 4),(ulong)in_ECX);
      }
      local_8 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x48);
      pcVar2 = std::
               unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
               ::release((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                          *)0x11601c);
      std::
      unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
      ::release((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                 *)0x11602e);
      cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
      ::cubeb_resampler_speex
                ((cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
                  *)local_8,pcVar2,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (cubeb_data_callback)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else {
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                          *)0x116082);
      if (bVar1) {
        if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
          (*g_cubeb_log_callback)
                    ("%s:%d: Resampling input (%d) to target and output rate of %dHz\n",
                     "cubeb_resampler_internal.h",0x23d,(ulong)*(uint *)(in_RSI + 4),(ulong)in_ECX);
        }
        local_8 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x48);
        pcVar2 = std::
                 unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                 ::release((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                            *)0x1160ff);
        std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::release
                  ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
                   0x116111);
        cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>::
        cubeb_resampler_speex
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(delay_line<float> *)local_8,
                   (cubeb_stream *)pcVar2,(cubeb_data_callback)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
      }
      else {
        if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
          (*g_cubeb_log_callback)
                    ("%s:%d: Resampling output (%dHz) to target and input rate of %dHz\n",
                     "cubeb_resampler_internal.h",0x244,(ulong)*(uint *)(in_RDX + 4),(ulong)in_ECX);
        }
        in_stack_ffffffffffffff10 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x48);
        ptr = std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::release
                        ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
                         0x1161cc);
        std::
        unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
        ::release((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                   *)0x1161dd);
        cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>::
        cubeb_resampler_speex
                  ((cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                    *)in_stack_ffffffffffffff30,(delay_line<float> *)in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   (cubeb_data_callback)in_stack_ffffffffffffff10,ptr);
        local_8 = in_stack_ffffffffffffff10;
      }
    }
  }
  else {
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: Input and output sample-rate match, target rate of %dHz\n",
                 "cubeb_resampler_internal.h",0x206,(ulong)in_ECX);
    }
    local_8 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x48);
    passthrough_resampler<float>::passthrough_resampler
              ((passthrough_resampler<float> *)in_stack_ffffffffffffff30,
               (cubeb_stream *)in_stack_ffffffffffffff28,
               (cubeb_data_callback)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20),
               (uint32_t)in_stack_ffffffffffffff10);
  }
LAB_0011621e:
  std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::~unique_ptr
            ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
             in_stack_ffffffffffffff10);
  std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::~unique_ptr
            ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
             in_stack_ffffffffffffff10);
  std::
  unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
  ::~unique_ptr((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                 *)in_stack_ffffffffffffff10);
  std::
  unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
  ::~unique_ptr((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                 *)in_stack_ffffffffffffff10);
  return (cubeb_resampler *)local_8;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create_internal(cubeb_stream * stream,
                                cubeb_stream_params * input_params,
                                cubeb_stream_params * output_params,
                                unsigned int target_rate,
                                cubeb_data_callback callback, void * user_ptr,
                                cubeb_resampler_quality quality,
                                cubeb_resampler_reclock reclock)
{
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> input_resampler = nullptr;
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> output_resampler = nullptr;
  std::unique_ptr<delay_line<T>> input_delay = nullptr;
  std::unique_ptr<delay_line<T>> output_delay = nullptr;

  assert((input_params || output_params) &&
         "need at least one valid parameter pointer.");

  /* All the streams we have have a sample rate that matches the target
     sample rate, use a no-op resampler, that simply forwards the buffers to the
     callback. */
  if (((input_params && input_params->rate == target_rate) &&
       (output_params && output_params->rate == target_rate)) ||
      (input_params && !output_params && (input_params->rate == target_rate)) ||
      (output_params && !input_params &&
       (output_params->rate == target_rate))) {
    LOG("Input and output sample-rate match, target rate of %dHz", target_rate);
    return new passthrough_resampler<T>(
        stream, callback, user_ptr, input_params ? input_params->channels : 0,
        target_rate);
  }

  /* Determine if we need to resampler one or both directions, and create the
     resamplers. */
  if (output_params && (output_params->rate != target_rate)) {
    output_resampler.reset(new cubeb_resampler_speex_one_way<T>(
        output_params->channels, target_rate, output_params->rate,
        to_speex_quality(quality)));
    if (!output_resampler) {
      return NULL;
    }
  }

  if (input_params && (input_params->rate != target_rate)) {
    input_resampler.reset(new cubeb_resampler_speex_one_way<T>(
        input_params->channels, input_params->rate, target_rate,
        to_speex_quality(quality)));
    if (!input_resampler) {
      return NULL;
    }
  }

  /* If we resample only one direction but we have a duplex stream, insert a
   * delay line with a length equal to the resampler latency of the
   * other direction so that the streams are synchronized. */
  if (input_resampler && !output_resampler && input_params && output_params) {
    output_delay.reset(new delay_line<T>(input_resampler->latency(),
                                         output_params->channels,
                                         output_params->rate));
    if (!output_delay) {
      return NULL;
    }
  } else if (output_resampler && !input_resampler && input_params &&
             output_params) {
    input_delay.reset(new delay_line<T>(output_resampler->latency(),
                                        input_params->channels,
                                        output_params->rate));
    if (!input_delay) {
      return NULL;
    }
  }

  if (input_resampler && output_resampler) {
    LOG("Resampling input (%d) and output (%d) to target rate of %dHz",
        input_params->rate, output_params->rate, target_rate);
    return new cubeb_resampler_speex<T, cubeb_resampler_speex_one_way<T>,
                                     cubeb_resampler_speex_one_way<T>>(
        input_resampler.release(), output_resampler.release(), stream, callback,
        user_ptr);
  } else if (input_resampler) {
    LOG("Resampling input (%d) to target and output rate of %dHz",
        input_params->rate, target_rate);
    return new cubeb_resampler_speex<T, cubeb_resampler_speex_one_way<T>,
                                     delay_line<T>>(input_resampler.release(),
                                                    output_delay.release(),
                                                    stream, callback, user_ptr);
  } else {
    LOG("Resampling output (%dHz) to target and input rate of %dHz",
        output_params->rate, target_rate);
    return new cubeb_resampler_speex<T, delay_line<T>,
                                     cubeb_resampler_speex_one_way<T>>(
        input_delay.release(), output_resampler.release(), stream, callback,
        user_ptr);
  }
}